

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

type * Disa::operator+(type *__return_storage_ptr__,Vector_Dense<double,_0UL> *vector0,
                      Vector_Dense<double,_0UL> *vector1)

{
  source_location *psVar1;
  source_location *location;
  ostream *poVar2;
  size_type sVar3;
  anon_class_16_2_91b2bd8a local_148;
  function<double_(unsigned_long)> local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<double,_std::allocator<double>_> *local_20;
  Vector_Dense<double,_0UL> *vector1_local;
  Vector_Dense<double,_0UL> *vector0_local;
  
  local_20 = &vector1->super_vector<double,_std::allocator<double>_>;
  vector1_local = vector0;
  vector0_local = __return_storage_ptr__;
  psVar1 = (source_location *)
           std::vector<double,_std::allocator<double>_>::size
                     (&vector0->super_vector<double,_std::allocator<double>_>);
  location = (source_location *)std::vector<double,_std::allocator<double>_>::size(local_20);
  if (psVar1 != location) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001b6420;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      (&vector1_local->super_vector<double,_std::allocator<double>_>);
    std::__cxx11::to_string(&local_f8,sVar3);
    std::operator+(&local_d8,"Incompatible vector sizes, ",&local_f8);
    std::operator+(&local_b8,&local_d8," vs. ");
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_20);
    std::__cxx11::to_string(&local_118,sVar3);
    std::operator+(&local_98,&local_b8,&local_118);
    std::operator+(&local_78,&local_98,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_78);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  local_148.vector0 = vector1_local;
  local_148.vector1 = (Vector_Dense<double,_0UL> *)local_20;
  std::function<double(unsigned_long)>::operator+
            ((function<double(unsigned_long)> *)&local_138,&local_148);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    (&vector1_local->super_vector<double,_std::allocator<double>_>);
  Vector_Dense<double,_0UL>::Vector_Dense(__return_storage_ptr__,&local_138,sVar3);
  std::function<double_(unsigned_long)>::~function(&local_138);
  return __return_storage_ptr__;
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type constexpr operator+(
const Vector_Dense<_type, _size_0>& vector0, const Vector_Dense<_type, _size_1>& vector1) {
  ASSERT_DEBUG(vector0.size() == vector1.size(), "Incompatible vector sizes, " + std::to_string(vector0.size()) +
                                                 " vs. " + std::to_string(vector1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  return _return_vector([&](const std::size_t ii) { return vector0[ii] + vector1[ii]; }, vector0.size());
}